

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor-xor-rle-per-draw-list-with-vtx-offset.cpp
# Opt level: O3

void __thiscall
ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::~XorRlePerDrawListWithVtxOffset
          (XorRlePerDrawListWithVtxOffset *this)

{
  Impl *pIVar1;
  
  (this->super_Interface)._vptr_Interface =
       (_func_int **)&PTR__XorRlePerDrawListWithVtxOffset_001a7d00;
  pIVar1 = (this->m_impl)._M_t.
           super___uniq_ptr_impl<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl,_std::default_delete<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl_*,_std::default_delete<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl>_>
           .
           super__Head_base<0UL,_ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl_*,_false>
           ._M_head_impl;
  if (pIVar1 != (Impl *)0x0) {
    operator_delete(pIVar1,1);
  }
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl,_std::default_delete<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl_*,_std::default_delete<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl>_>
  .super__Head_base<0UL,_ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::Impl_*,_false>.
  _M_head_impl = (Impl *)0x0;
  Interface::~Interface(&this->super_Interface);
  return;
}

Assistant:

bool XorRlePerDrawListWithVtxOffset::setDrawData(const ::ImDrawData * drawData) {
    m_drawListsPrev = m_drawListsCur;

    uint32_t nCmdLists = drawData->CmdListsCount;
    m_drawListsCur.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; iList++) {
        m_drawListsCur[iList].clear();
        ::writeCmdListToBuffer(drawData->CmdLists[iList], m_drawListsCur[iList]);
    }

    // calculate diff

    m_drawListsDiff.clear();
    m_drawListsDiff.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; ++iList) {
        auto & bufferCur = m_drawListsCur[iList];
        auto & bufferDiff = m_drawListsDiff[iList];

        bufferDiff.clear();

        int32_t type = 1; // Run-Length Encoding
        if (iList >= m_drawListsPrev.size() || m_drawListsPrev[iList].size() != bufferCur.size()) {
            type = 0; // Full update
        }

        std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(bufferDiff));

        if (type == 0) {
            std::copy(bufferCur.begin(), bufferCur.end(), std::back_inserter(bufferDiff));
        } else if (type == 1) {
            auto & bufferPrev = m_drawListsPrev[iList];

            uint32_t a = 0;
            uint32_t b = 0;
            uint32_t c = 0;
            uint32_t n = 0;

            for (int i = 0; i < (int) bufferCur.size(); i += 4) {
                std::memcpy((char *)(&a), bufferPrev.data() + i, sizeof(uint32_t));
                std::memcpy((char *)(&b), bufferCur.data() + i, sizeof(uint32_t));
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    if (n > 0) {
                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    }
                    n = 1;
                    c = a;
                }
            }

            if (bufferCur.size() % 4 != 0) {
                a = 0;
                b = 0;
                uint32_t i = (bufferCur.size()/4)*4;
                uint32_t k = bufferCur.size() - i;
                std::memcpy((char *)(&a), bufferPrev.data() + i, k);
                std::memcpy((char *)(&b), bufferCur.data() + i, k);
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    n = 1;
                    c = a;
                }
            }

            std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
            std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
        }
    }

    return true;
}